

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O2

int main(void)

{
  UTF8Reader UVar1;
  bool bVar2;
  LineAndColumn LVar3;
  ostream *poVar4;
  UTF8Reader UVar5;
  long in_FS_OFFSET;
  TokenType type;
  CodeLocation location;
  string inputText;
  CodeLocation loc;
  string local_3c8;
  SimpleTokeniser tokenizer;
  SourceFile sourceFile;
  CompileMessageHandler handler;
  CompileMessageList errors;
  Allocator allocator;
  ifstream input;
  byte abStack_208 [488];
  
  std::ifstream::ifstream(&input,"../test/ringtone.soul",_S_in);
  inputText._M_dataplus._M_p = (pointer)&inputText.field_2;
  inputText._M_string_length = 0;
  inputText.field_2._M_local_buf[0] = '\0';
  do {
    std::istream::get();
    std::__cxx11::string::push_back((char)&inputText);
  } while ((abStack_208[*(long *)(_input + -0x18)] & 2) == 0);
  inputText._M_dataplus._M_p[inputText._M_string_length - 1] = '\0';
  soul::AST::Allocator::Allocator(&allocator);
  soul::AST::createRootNamespace(&allocator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sourceFile,"ringtone.soul",(allocator<char> *)&tokenizer);
  std::__cxx11::string::string((string *)&sourceFile.content,(string *)&inputText);
  soul::CodeLocation::createFromSourceFile(&location,&sourceFile);
  errors.messages.super__Vector_base<soul::CompileMessage,_std::allocator<soul::CompileMessage>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  errors.messages.super__Vector_base<soul::CompileMessage,_std::allocator<soul::CompileMessage>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  errors.onMessage.super__Function_base._M_manager = (_Manager_type)0x0;
  errors.onMessage._M_invoker = (_Invoker_type)0x0;
  errors.onMessage.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  errors.onMessage.super__Function_base._M_functor._8_8_ = 0;
  errors.messages.super__Vector_base<soul::CompileMessage,_std::allocator<soul::CompileMessage>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  soul::CompileMessageHandler::CompileMessageHandler(&handler,&errors);
  *(CompileMessageHandler **)(in_FS_OFFSET + -8) = &handler;
  soul::SimpleTokeniser::SimpleTokeniser(&tokenizer,&location,true);
  soul::CodeLocation::getOffset(&loc,(uint32_t)&location,0x19);
  type.text = (char *)0x0;
  UVar5 = tokenizer.super_SOULTokeniser.startLocation.location;
  do {
    bVar2 = soul::
            Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&tokenizer.super_SOULTokeniser,(TokenType)0x29b6f4);
    if (bVar2) {
LAB_001f0f74:
      soul::RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&loc.sourceCode);
      soul::
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::~Tokeniser(&tokenizer.super_SOULTokeniser);
      soul::CompileMessageHandler::~CompileMessageHandler(&handler);
      soul::CompileMessageList::~CompileMessageList(&errors);
      soul::RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&location.sourceCode);
      soul::SourceFile::~SourceFile(&sourceFile);
      soul::AST::Allocator::~Allocator(&allocator);
      std::__cxx11::string::~string((string *)&inputText);
      std::ifstream::~ifstream(&input);
      return 0;
    }
    LVar3 = soul::CodeLocation::getLineAndColumn(&tokenizer.super_SOULTokeniser.location);
    UVar1 = tokenizer.super_SOULTokeniser.location.location;
    if ((ulong)LVar3 >> 0x23 != 0 && 10 < LVar3.line) {
      soul::TokenType::getDescription_abi_cxx11_(&local_3c8,&type);
      poVar4 = std::operator<<((ostream *)&std::cout,(string *)&local_3c8);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)&local_3c8);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,UVar5.data,
                          (long)tokenizer.super_SOULTokeniser.location.location.data -
                          (long)UVar5.data);
      std::endl<char,std::char_traits<char>>(poVar4);
      goto LAB_001f0f74;
    }
    type = tokenizer.super_SOULTokeniser.currentType;
    soul::
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::skip(&tokenizer.super_SOULTokeniser);
    UVar5 = UVar1;
  } while( true );
}

Assistant:

int main()
{
    std::ifstream input("../test/ringtone.soul", std::ios::in);
    std::string inputText;
    do
    {
        inputText += input.get();
    } while (!input.eof());
    inputText[inputText.size() - 1] = 0;

    soul::AST::Allocator allocator;
    soul::pool_ptr<soul::AST::Namespace> topLevelNamespace = soul::AST::createRootNamespace(allocator);
    auto sourceFile = soul::SourceFile{"ringtone.soul", inputText};
    soul::CodeLocation location = soul::CodeLocation::createFromSourceFile(sourceFile);

    CompileMessageList errors;
    CompileMessageHandler handler(errors);
    soul::messageHandler = &handler;
    try
    {
        // auto ast = soul::Compiler::parseTopLevelDeclarations(allocator, location, *topLevelNamespace);

        // struct Visitor : public ASTVisitor
        // {
        // public:
        //     void visitObject(AST::ModuleBase &base)
        //     {
        //         ASTVisitor::visitObject(base);
        //     }
        //     void visit(AST::Block &b)
        //     {
        //         ASTVisitor::visit(b);
        //         auto range = SourceCodeUtilities::iterateSyntaxTokens(b);
        //         auto start = range.start.getLineAndColumn();
        //         auto end = range.end.getLineAndColumn();
        //         std::cout << start.line << " " << start.column << std::endl;
        //         std::cout << end.line << " " << end.column << std::endl;
        //     }

        //     std::vector<Definition> definitions;
        //     std::vector<Definition> references;
        //     pool_ptr<CodeLocation> location;
        // };

        // Visitor test;
        // test.location = location;
        // test.visitObject(ast[0].get());

        SimpleTokeniser tokenizer(location, true);
        auto loc = location.getOffset(25, 20);
        auto lastPos = tokenizer.startLocation.location;
        std::string_view last;
        TokenType type;

        while (!tokenizer.matches(Token::eof))
        {
            auto start = tokenizer.location.getLineAndColumn();
            if (start.line >= 11 && start.column > 7)
            {
                std::cout << type.getDescription() << std::endl;
                std::string_view str(
                    lastPos.getAddress(), tokenizer.location.location.getAddress() - lastPos.getAddress());
                std::cout << str << std::endl;
                break;
            }
            type = tokenizer.currentType;
            lastPos = tokenizer.location.location;
            tokenizer.skip();
        }

        // SourceCodeUtilities::findASTObjectAt(*ast[0].get().getAsBlock(), location.getOffset(25, 20));
        // for (auto fn : ast[0].get().getFunctions())
        // {
        //     // auto obj = SourceCodeUtilities::findASTObjectAt(fn.get(), location.getOffset(25, 20));
        // }

        // for (auto def : test.definitions)
        // {
        //     auto start = def.start.getLineAndColumn();
        //     std::cout << "D" << start.line << ":" << start.column << "-" << start.column + def.name.size() << ":" << def.name << std::endl;
        // }

        // for (auto def : test.references)
        // {
        //     auto start = def.start.getLineAndColumn();
        //     std::cout << "R" << start.line << ":" << start.column << "-" << start.column + def.name.size() << ":" << def.name << std::endl;
        // }

        // if (found != nullptr)
        // {
        // }
        // else
        // {
        //     std::cout << "No results found" << std::endl;
        // }
    }
    catch (AbortCompilationException ex)
    {
        std::cout << errors.toString() << std::endl;
    }
}